

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaDec.cpp
# Opt level: O0

void crnlib::LzmaDec_WriteRem(CLzmaDec *p,SizeT limit)

{
  uint uVar1;
  Byte *pBVar2;
  SizeT SVar3;
  SizeT local_50;
  uint local_34;
  UInt32 rep0;
  uint len;
  SizeT dicBufSize;
  SizeT dicPos;
  Byte *dic;
  SizeT limit_local;
  CLzmaDec *p_local;
  
  if ((p->remainLen != 0) && (p->remainLen < 0x112)) {
    pBVar2 = p->dic;
    dicBufSize = p->dicPos;
    SVar3 = p->dicBufSize;
    local_34 = p->remainLen;
    uVar1 = p->reps[0];
    if (limit - dicBufSize < (ulong)local_34) {
      local_34 = (int)limit - (int)dicBufSize;
    }
    if ((p->checkDicSize == 0) && ((p->prop).dicSize - p->processedPos <= local_34)) {
      p->checkDicSize = (p->prop).dicSize;
    }
    p->processedPos = local_34 + p->processedPos;
    p->remainLen = p->remainLen - local_34;
    while (local_34 != 0) {
      local_50 = SVar3;
      if (uVar1 <= dicBufSize) {
        local_50 = 0;
      }
      pBVar2[dicBufSize] = pBVar2[(dicBufSize - uVar1) + local_50];
      dicBufSize = dicBufSize + 1;
      local_34 = local_34 - 1;
    }
    p->dicPos = dicBufSize;
  }
  return;
}

Assistant:

static void MY_FAST_CALL LzmaDec_WriteRem(CLzmaDec* p, SizeT limit) {
  if (p->remainLen != 0 && p->remainLen < kMatchSpecLenStart) {
    Byte* dic = p->dic;
    SizeT dicPos = p->dicPos;
    SizeT dicBufSize = p->dicBufSize;
    unsigned len = p->remainLen;
    UInt32 rep0 = p->reps[0];
    if (limit - dicPos < len)
      len = (unsigned)(limit - dicPos);

    if (p->checkDicSize == 0 && p->prop.dicSize - p->processedPos <= len)
      p->checkDicSize = p->prop.dicSize;

    p->processedPos += len;
    p->remainLen -= len;
    while (len-- != 0) {
      dic[dicPos] = dic[(dicPos - rep0) + ((dicPos < rep0) ? dicBufSize : 0)];
      dicPos++;
    }
    p->dicPos = dicPos;
  }
}